

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

function<int_()> * __thiscall
cmake::BuildWorkflowStep
          (function<int_()> *__return_storage_ptr__,cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmUVProcessChainBuilder *pcVar1;
  cmUVProcessChainBuilder builder;
  cmUVProcessChainBuilder local_78;
  
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
  pcVar1 = cmUVProcessChainBuilder::AddCommand(&builder,args);
  pcVar1 = cmUVProcessChainBuilder::SetExternalStream(pcVar1,Stream_OUTPUT,_stdout);
  cmUVProcessChainBuilder::SetExternalStream(pcVar1,Stream_ERROR,_stderr);
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_78,&builder);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  pcVar1 = (cmUVProcessChainBuilder *)operator_new(0x60);
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(pcVar1,&local_78);
  *(cmUVProcessChainBuilder **)&(__return_storage_ptr__->super__Function_base)._M_functor = pcVar1;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmake.cxx:3940:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmake.cxx:3940:10)>
       ::_M_manager;
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder(&local_78);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder(&builder);
  return __return_storage_ptr__;
}

Assistant:

std::function<int()> cmake::BuildWorkflowStep(
  const std::vector<std::string>& args)
{
  cmUVProcessChainBuilder builder;
  builder.AddCommand(args)
    .SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, stdout)
    .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, stderr);
  return [builder]() -> int {
    auto chain = builder.Start();
    chain.Wait();
    return static_cast<int>(chain.GetStatus(0).ExitStatus);
  };
}